

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::dispose
          (Array<capnp::_::DirectWireValue<unsigned_int>_> *this)

{
  DirectWireValue<unsigned_int> *pDVar1;
  size_t sVar2;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (DirectWireValue<unsigned_int> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (DirectWireValue<unsigned_int> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pDVar1,4,sVar2,sVar2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }